

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variablesio.cpp
# Opt level: O3

void __thiscall
bal::VariableTextReader::read_variable_sequence_
          (VariableTextReader *this,uint *sequence_size,int *step_size)

{
  TextReader *pTVar1;
  _func_int **pp_Var2;
  uint32_t uVar3;
  int32_t iVar4;
  ulong uVar5;
  _func_int *p_Var6;
  bool bVar7;
  
  *sequence_size = 1;
  *step_size = 0;
  pp_Var2 = this->_vptr_VariableTextReader;
  p_Var6 = pp_Var2[-3];
  uVar5 = *(ulong *)(&this->field_0x8 + (long)p_Var6);
  if (uVar5 < *(ulong *)(&this->field_0x20 + (long)p_Var6)) {
    bVar7 = *(long *)(&this->field_0x10 + (long)p_Var6) == 0;
    do {
      uVar5 = uVar5 + 1;
      if (*(char *)(*(long *)(&this->field_0x18 + (long)p_Var6) + -1 + uVar5) != ' ') break;
      *(ulong *)(&this->field_0x8 + (long)p_Var6) = uVar5;
      if (!bVar7) {
        *(undefined8 *)(&this->field_0x10 + (long)p_Var6) = 0;
        *(undefined4 *)(&this->field_0x40 + (long)p_Var6) = 0;
      }
      bVar7 = true;
    } while (uVar5 != *(ulong *)(&this->field_0x20 + (long)p_Var6));
    p_Var6 = pp_Var2[-3];
  }
  pTVar1 = (TextReader *)((long)&this->_vptr_VariableTextReader + (long)p_Var6);
  TextReader::load_next_token(pTVar1);
  if ((*(long *)(&this->field_0x10 + (long)p_Var6) != 0) &&
     ((pTVar1->current_line_)._M_dataplus._M_p[pTVar1->current_token_pos_] == '/')) {
    pp_Var2 = this->_vptr_VariableTextReader;
    p_Var6 = pp_Var2[-3];
    if (*(long *)(&this->field_0x10 + (long)p_Var6) != 0) {
      *(long *)(&this->field_0x8 + (long)p_Var6) = *(long *)(&this->field_0x8 + (long)p_Var6) + 1;
      *(undefined8 *)(&this->field_0x10 + (long)p_Var6) = 0;
      *(undefined4 *)(&this->field_0x40 + (long)p_Var6) = 0;
      p_Var6 = pp_Var2[-3];
    }
    uVar5 = *(ulong *)(&this->field_0x8 + (long)p_Var6);
    if (uVar5 < *(ulong *)(&this->field_0x20 + (long)p_Var6)) {
      bVar7 = *(long *)(&this->field_0x10 + (long)p_Var6) == 0;
      do {
        uVar5 = uVar5 + 1;
        if (*(char *)(*(long *)(&this->field_0x18 + (long)p_Var6) + -1 + uVar5) != ' ') break;
        *(ulong *)(&this->field_0x8 + (long)p_Var6) = uVar5;
        if (!bVar7) {
          *(undefined8 *)(&this->field_0x10 + (long)p_Var6) = 0;
          *(undefined4 *)(&this->field_0x40 + (long)p_Var6) = 0;
        }
        bVar7 = true;
      } while (uVar5 != *(ulong *)(&this->field_0x20 + (long)p_Var6));
      p_Var6 = pp_Var2[-3];
    }
    uVar3 = TextReader::read_uint32
                      ((TextReader *)((long)&this->_vptr_VariableTextReader + (long)p_Var6),0,
                       0xffffffff);
    *sequence_size = uVar3;
    pp_Var2 = this->_vptr_VariableTextReader;
    p_Var6 = pp_Var2[-3];
    uVar5 = *(ulong *)(&this->field_0x8 + (long)p_Var6);
    if (uVar5 < *(ulong *)(&this->field_0x20 + (long)p_Var6)) {
      bVar7 = *(long *)(&this->field_0x10 + (long)p_Var6) == 0;
      do {
        uVar5 = uVar5 + 1;
        if (*(char *)(*(long *)(&this->field_0x18 + (long)p_Var6) + -1 + uVar5) != ' ') break;
        *(ulong *)(&this->field_0x8 + (long)p_Var6) = uVar5;
        if (!bVar7) {
          *(undefined8 *)(&this->field_0x10 + (long)p_Var6) = 0;
          *(undefined4 *)(&this->field_0x40 + (long)p_Var6) = 0;
        }
        bVar7 = true;
      } while (uVar5 != *(ulong *)(&this->field_0x20 + (long)p_Var6));
      p_Var6 = pp_Var2[-3];
    }
    pTVar1 = (TextReader *)((long)&this->_vptr_VariableTextReader + (long)p_Var6);
    TextReader::load_next_token(pTVar1);
    if ((*(long *)(&this->field_0x10 + (long)p_Var6) != 0) &&
       ((pTVar1->current_line_)._M_dataplus._M_p[pTVar1->current_token_pos_] == '/')) {
      pp_Var2 = this->_vptr_VariableTextReader;
      p_Var6 = pp_Var2[-3];
      if (*(long *)(&this->field_0x10 + (long)p_Var6) != 0) {
        *(long *)(&this->field_0x8 + (long)p_Var6) = *(long *)(&this->field_0x8 + (long)p_Var6) + 1;
        *(undefined8 *)(&this->field_0x10 + (long)p_Var6) = 0;
        *(undefined4 *)(&this->field_0x40 + (long)p_Var6) = 0;
        p_Var6 = pp_Var2[-3];
      }
      uVar5 = *(ulong *)(&this->field_0x8 + (long)p_Var6);
      if (uVar5 < *(ulong *)(&this->field_0x20 + (long)p_Var6)) {
        bVar7 = *(long *)(&this->field_0x10 + (long)p_Var6) == 0;
        do {
          uVar5 = uVar5 + 1;
          if (*(char *)(*(long *)(&this->field_0x18 + (long)p_Var6) + -1 + uVar5) != ' ') break;
          *(ulong *)(&this->field_0x8 + (long)p_Var6) = uVar5;
          if (!bVar7) {
            *(undefined8 *)(&this->field_0x10 + (long)p_Var6) = 0;
            *(undefined4 *)(&this->field_0x40 + (long)p_Var6) = 0;
          }
          bVar7 = true;
        } while (uVar5 != *(ulong *)(&this->field_0x20 + (long)p_Var6));
        p_Var6 = pp_Var2[-3];
      }
      iVar4 = TextReader::read_sint32
                        ((TextReader *)((long)&this->_vptr_VariableTextReader + (long)p_Var6));
      *step_size = iVar4;
      p_Var6 = this->_vptr_VariableTextReader[-3];
      uVar5 = *(ulong *)(&this->field_0x8 + (long)p_Var6);
      if (uVar5 < *(ulong *)(&this->field_0x20 + (long)p_Var6)) {
        bVar7 = *(long *)(&this->field_0x10 + (long)p_Var6) == 0;
        do {
          uVar5 = uVar5 + 1;
          if (*(char *)(*(long *)(&this->field_0x18 + (long)p_Var6) + -1 + uVar5) != ' ') {
            return;
          }
          *(ulong *)(&this->field_0x8 + (long)p_Var6) = uVar5;
          if (!bVar7) {
            *(undefined8 *)(&this->field_0x10 + (long)p_Var6) = 0;
            *(undefined4 *)(&this->field_0x40 + (long)p_Var6) = 0;
          }
          bVar7 = true;
        } while (uVar5 != *(ulong *)(&this->field_0x20 + (long)p_Var6));
      }
    }
  }
  return;
}

Assistant:

inline void VariableTextReader::read_variable_sequence_(unsigned int& sequence_size, signed int& step_size) {
        sequence_size = 1;
        step_size = 0;
        
        skip_space();
        if (is_symbol('/')) {
            skip_symbol();
            skip_space();
            sequence_size = read_uint32();
            skip_space();
            if (is_symbol('/')) {
                skip_symbol();
                skip_space();
                step_size = read_sint32();
                skip_space();
            };
        };
    }